

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gccode.c
# Opt level: O1

LispPTR reclaimcodeblock(LispPTR codebase)

{
  DLword *pDVar1;
  byte bVar2;
  uint uVar3;
  DLword *pDVar4;
  LispPTR LVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  char local_f8 [200];
  
  if (*Closure_Cache_Enabled_word == 0) {
LAB_00122f95:
    if ((codebase & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",codebase);
    }
    pDVar1 = Lisp_world;
    if ((-1 < *(short *)((ulong)(*(uint *)(Lisp_world + (ulong)codebase + 4) >> 8 & 0xffffe) +
                         (long)MDStypetbl ^ 2)) && (*GcDisabled_word != 0x4c)) {
      rec_htfind(*(uint *)(Lisp_world + (ulong)codebase + 4) & 0xfffffff,1);
    }
    if (pDVar1[(ulong)codebase + 2] != 0) {
      if ((codebase & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",codebase);
      }
      pDVar1 = Lisp_world + codebase;
      uVar10 = (ulong)pDVar1[2] + (long)pDVar1;
      do {
        bVar2 = *(byte *)(uVar10 ^ 3);
        if (bVar2 == 0x6f) {
          uVar7 = (uint)*(byte *)(uVar10 + 2 ^ 3) << 0x10 | (uint)*(byte *)(uVar10 + 1 ^ 3) << 0x18;
          uVar6 = (uint)*(byte *)(uVar10 + 3 ^ 3) << 8;
          uVar11 = (uint)*(byte *)(uVar10 + 4 ^ 3) | uVar6 | uVar7;
          if (((uVar11 != codebase) &&
              (-1 < *(short *)((ulong)((uVar6 & 0xfffffe00 | uVar7) >> 8) + (long)MDStypetbl ^ 2)))
             && (*GcDisabled_word != 0x4c)) {
            rec_htfind(uVar11,1);
          }
        }
        else if (bVar2 == 0) break;
        uVar6 = oplength[(uint)bVar2];
        if (5 < uVar6) {
          sprintf(local_f8,
                  "Unrecognized bytecode (0%o) at offset 0%to in code block x%x,x%x; continue to use UFN length"
                  ,(ulong)(uint)bVar2,uVar10 - (long)pDVar1,(ulong)(codebase >> 0x10) & 0xff,
                  (ulong)codebase & 0xffff);
          error(local_f8);
          uVar6 = (uint)(UFNTable[(ulong)bVar2 * 2] >> 8);
          oplength[bVar2] = uVar6;
        }
        uVar10 = uVar10 + uVar6 + 1;
      } while( true );
    }
    LVar5 = 0;
  }
  else {
    uVar10 = (ulong)*Closure_Cache_word;
    if ((*Closure_Cache_word & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar10);
    }
    pDVar1 = Lisp_world;
    uVar7 = codebase >> 9 & 0x7f ^ codebase * 8 & 0xffff ^ codebase >> 0x10 & 0xfff;
    uVar6 = *(uint *)(Lisp_world + uVar10);
    uVar12 = *(uint *)(Lisp_world + uVar10 + 2) >> 0x10;
    uVar11 = uVar12 & uVar7;
    if ((uVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
    }
    uVar8 = *(uint *)(Lisp_world + (uVar6 + uVar11 * 2));
    if (uVar8 == *Deleted_Implicit_Hash_Slot_word) {
LAB_00122dd7:
      uVar8 = 0x3f;
      if (uVar12 < 0x3f) {
        uVar8 = uVar12;
      }
      do {
        do {
          uVar11 = uVar11 + (uVar8 & (uVar7 >> 8 ^ uVar7) | 1) & uVar12;
          if ((uVar6 & 1) != 0) {
            printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
          }
          uVar3 = *(uint *)(Lisp_world + (uVar6 + uVar11 * 2));
        } while (uVar3 == *Deleted_Implicit_Hash_Slot_word);
        if ((ulong)uVar3 == 0) goto LAB_00122f95;
        if ((uVar3 & 1) != 0) {
          printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
        }
      } while ((*(uint *)(Lisp_world + uVar3) & 0xfffffff) != codebase);
    }
    else {
      if ((ulong)uVar8 == 0) goto LAB_00122f95;
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
      }
      if ((*(uint *)(Lisp_world + uVar8) & 0xfffffff) != codebase) goto LAB_00122dd7;
    }
    if ((-1 < *(short *)((ulong)(*Deleted_Implicit_Hash_Slot_word >> 8 & 0xfffffffe) +
                         (long)MDStypetbl ^ 2)) && (*GcDisabled_word != 0x4c)) {
      rec_htfind(*Deleted_Implicit_Hash_Slot_word,0);
    }
    pDVar4 = MDStypetbl;
    uVar9 = (ulong)(uVar6 + uVar11 * 2);
    if ((uVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
    }
    if ((-1 < *(short *)((ulong)(pDVar4 + (*(uint *)(Lisp_world + uVar9) >> 9)) ^ 2)) &&
       (*GcDisabled_word != 0x4c)) {
      if ((uVar6 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
      }
      rec_htfind(*(LispPTR *)(Lisp_world + uVar9),1);
    }
    LVar5 = *Deleted_Implicit_Hash_Slot_word;
    if ((uVar6 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar9);
    }
    *(LispPTR *)(Lisp_world + uVar9) = LVar5;
    pDVar1[uVar10 + 5] = (DLword)(((ulong)pDVar1[uVar10 + 5] << 0x30) + -0x1000000000000 >> 0x30);
    LVar5 = 1;
  }
  return LVar5;
}

Assistant:

LispPTR reclaimcodeblock(LispPTR codebase) {
  struct fnhead *fnbase;
  if ((*Closure_Cache_Enabled_word != NIL) &&
      (remimplicitkeyhash(codebase, *Closure_Cache_word) != NIL)) {
    return (T);
  }
  fnbase = (struct fnhead *)NativeAligned4FromLAddr(codebase);
  REC_GCLOOKUP((POINTERMASK & fnbase->framename), DELREF);
  if (fnbase->startpc != 0) map_code_pointers(codebase, DELREF);
  return (NIL);
}